

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error FT_Render_Glyph_Internal(FT_Library library,FT_GlyphSlot slot,FT_Render_Mode render_mode)

{
  FT_Glyph_Format FVar1;
  void *pvVar2;
  FT_Error FVar3;
  FT_Error FVar4;
  FT_ListRec *pFVar5;
  FT_Renderer_conflict pFVar6;
  FT_ListNode pFVar7;
  
  FVar1 = slot->format;
  if (FVar1 == FT_GLYPH_FORMAT_BITMAP) {
    FVar4 = 0;
  }
  else if (FVar1 == FT_GLYPH_FORMAT_OUTLINE) {
    pFVar6 = library->cur_renderer;
    if (pFVar6 == (FT_Renderer_conflict)0x0) {
      FVar4 = 7;
    }
    else {
      pFVar7 = (library->renderers).head;
LAB_001359f6:
      FVar4 = 0;
      FVar3 = (*pFVar6->render)(pFVar6,slot,render_mode,(FT_Vector *)0x0);
      if (FVar3 != 0) {
        FVar4 = FVar3;
        while (((char)FVar4 == '\x13' && (library != (FT_Library)0x0))) {
          pFVar5 = (FT_ListRec *)&pFVar7->next;
          if (pFVar7 == (FT_ListNode)0x0) {
            pFVar5 = &library->renderers;
          }
          pFVar7 = pFVar5->head;
          if (pFVar7 == (FT_ListNode)0x0) {
            return FVar4;
          }
          while (pvVar2 = pFVar7->data, *(FT_Glyph_Format *)((long)pvVar2 + 0x20) != slot->format) {
            pFVar7 = pFVar7->next;
            if (pFVar7 == (FT_ListNode)0x0) {
              return FVar4;
            }
          }
          FVar4 = (**(code **)((long)pvVar2 + 0x78))(pvVar2,slot,render_mode,0);
          if (FVar4 == 0) {
            return 0;
          }
        }
      }
    }
  }
  else {
    FVar4 = 7;
    if (library != (FT_Library)0x0) {
      for (pFVar7 = (library->renderers).head; pFVar7 != (FT_ListNode)0x0; pFVar7 = pFVar7->next) {
        pFVar6 = (FT_Renderer_conflict)pFVar7->data;
        if (pFVar6->glyph_format == FVar1) goto LAB_001359f6;
      }
    }
  }
  return FVar4;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Render_Glyph_Internal( FT_Library      library,
                            FT_GlyphSlot    slot,
                            FT_Render_Mode  render_mode )
  {
    FT_Error     error = FT_Err_Ok;
    FT_Renderer  renderer;


    /* if it is already a bitmap, no need to do anything */
    switch ( slot->format )
    {
    case FT_GLYPH_FORMAT_BITMAP:   /* already a bitmap, don't do anything */
      break;

    default:
      {
        FT_ListNode  node = NULL;


        /* small shortcut for the very common case */
        if ( slot->format == FT_GLYPH_FORMAT_OUTLINE )
        {
          renderer = library->cur_renderer;
          node     = library->renderers.head;
        }
        else
          renderer = FT_Lookup_Renderer( library, slot->format, &node );

        error = FT_ERR( Unimplemented_Feature );
        while ( renderer )
        {
          error = renderer->render( renderer, slot, render_mode, NULL );
          if ( !error                                   ||
               FT_ERR_NEQ( error, Cannot_Render_Glyph ) )
            break;

          /* FT_Err_Cannot_Render_Glyph is returned if the render mode   */
          /* is unsupported by the current renderer for this glyph image */
          /* format.                                                     */

          /* now, look for another renderer that supports the same */
          /* format.                                               */
          renderer = FT_Lookup_Renderer( library, slot->format, &node );
        }
      }
    }

#ifdef FT_DEBUG_LEVEL_TRACE

#undef  FT_COMPONENT
#define FT_COMPONENT  trace_bitmap

    /*
     * Computing the MD5 checksum is expensive, unnecessarily distorting a
     * possible profiling of FreeType if compiled with tracing support.  For
     * this reason, we execute the following code only if explicitly
     * requested.
     */

    /* we use FT_TRACE3 in this block */
    if ( !error                             &&
         ft_trace_levels[trace_bitmap] >= 3 &&
         slot->bitmap.buffer                )
    {
      FT_Bitmap  bitmap;
      FT_Error   err;


      FT_Bitmap_Init( &bitmap );

      /* we convert to a single bitmap format for computing the checksum */
      /* this also converts the bitmap flow to `down' (i.e., pitch > 0)  */
      err = FT_Bitmap_Convert( library, &slot->bitmap, &bitmap, 1 );
      if ( !err )
      {
        MD5_CTX        ctx;
        unsigned char  md5[16];
        unsigned long  coverage = 0;
        int            i, j;
        int            rows  = (int)bitmap.rows;
        int            pitch = bitmap.pitch;


        FT_TRACE3(( "FT_Render_Glyph: bitmap %dx%d, mode %d\n",
                    rows, pitch, slot->bitmap.pixel_mode ));

        for ( i = 0; i < rows; i++ )
          for ( j = 0; j < pitch; j++ )
            coverage += bitmap.buffer[i * pitch + j];

        FT_TRACE3(( "  Total coverage: %lu\n", coverage ));

        MD5_Init( &ctx );
        if ( bitmap.buffer )
          MD5_Update( &ctx, bitmap.buffer,
                      (unsigned long)rows * (unsigned long)pitch );
        MD5_Final( md5, &ctx );

        FT_TRACE3(( "  MD5 checksum: " ));
        for ( i = 0; i < 16; i++ )
          FT_TRACE3(( "%02X", md5[i] ));
        FT_TRACE3(( "\n" ));
      }

      FT_Bitmap_Done( library, &bitmap );
    }

    /*
     * Dump bitmap in Netpbm format (PBM or PGM).
     */

    /* we use FT_TRACE7 in this block */
    if ( !error                             &&
         ft_trace_levels[trace_bitmap] >= 7 &&
         slot->bitmap.rows  < 128U          &&
         slot->bitmap.width < 128U          &&
         slot->bitmap.buffer                )
    {
      int  rows  = (int)slot->bitmap.rows;
      int  width = (int)slot->bitmap.width;
      int  pitch =      slot->bitmap.pitch;
      int  i, j, m;
      unsigned char*  topleft = slot->bitmap.buffer;

      if ( pitch < 0 )
        topleft -= pitch * ( rows - 1 );

      FT_TRACE7(( "Netpbm image: start\n" ));
      switch ( slot->bitmap.pixel_mode )
      {
      case FT_PIXEL_MODE_MONO:
        FT_TRACE7(( "P1 %d %d\n", width, rows ));
        for ( i = 0; i < rows; i++ )
        {
          for ( j = 0; j < width; )
            for ( m = 128; m > 0 && j < width; m >>= 1, j++ )
              FT_TRACE7(( " %d", ( topleft[i * pitch + j / 8] & m ) != 0 ));
          FT_TRACE7(( "\n" ));
        }
        break;

      default:
        FT_TRACE7(( "P2 %d %d 255\n", width, rows ));
        for ( i = 0; i < rows; i++ )
        {
          for ( j = 0; j < width; j += 1 )
            FT_TRACE7(( " %3u", topleft[i * pitch + j] ));
          FT_TRACE7(( "\n" ));
        }
      }
      FT_TRACE7(( "Netpbm image: end\n" ));
    }

#undef  FT_COMPONENT
#define FT_COMPONENT  trace_objs

#endif /* FT_DEBUG_LEVEL_TRACE */

    return error;
  }